

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::WheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  float fVar3;
  pointer pmVar4;
  _Rb_tree_color *p_Var5;
  iterator iVar6;
  int *piVar7;
  pointer pfVar8;
  pointer pfVar9;
  _Rb_tree_color _Var10;
  long lVar11;
  undefined8 uVar12;
  undefined1 auVar13 [8];
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  mapped_type *pmVar16;
  code *pcVar17;
  vector<float,std::allocator<float>> *pvVar18;
  _Base_ptr p_Var19;
  mapped_type_conflict2 *pmVar20;
  mapped_type *pmVar21;
  _Rb_tree_node_base *p_Var22;
  ulong uVar23;
  undefined4 in_register_0000000c;
  int __tmp;
  _Rb_tree_node_base *p_Var24;
  long lVar25;
  _Rb_tree_color *p_Var26;
  undefined4 uVar27;
  undefined4 uVar28;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> s;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  maxCount;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  undefined1 local_148 [16];
  pointer local_138;
  int local_11c;
  undefined1 local_118 [8];
  undefined1 auStack_110 [8];
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  size_t local_f0;
  vector<int,_std::allocator<int>_> *local_e0;
  _Base_ptr local_d8;
  pointer local_d0;
  int local_c4;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_c0;
  ulong local_90;
  pointer local_88;
  _Base_ptr local_80;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_78;
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_70;
  pointer local_40;
  pointer local_38;
  
  local_c4 = eptype;
  local_e0 = handles;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_11c = eptype_tvar;
  if (s.first.summary_id == 0) {
    local_90 = (ulong)(uint)this->samplesize_;
    pmVar4 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var22 = *(_Base_ptr *)((long)&pmVar4[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var24 = &pmVar4[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var22 != p_Var24) {
      do {
        _Var10 = p_Var22[1]._M_color;
        local_118 = *(undefined1 (*) [8])(p_Var22 + 1);
        iVar2 = *(int *)&p_Var22[1]._M_parent;
        auStack_110 = (undefined1  [8])p_Var22[1]._M_parent;
        local_108 = (_Base_ptr)CONCAT44(local_108._4_4_,*(undefined4 *)&p_Var22[1]._M_left);
        pcVar17 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          pcVar17 = *(code **)(*(long *)(auStack_110 + CONCAT44(in_register_0000000c,epcalc) + 4) +
                               -1 + GetOutLoss);
        }
        uVar28 = (*pcVar17)(auStack_110 + CONCAT44(in_register_0000000c,epcalc) + 4);
        local_148._0_4_ = uVar28;
        local_c0._M_impl._4_4_ = iVar2;
        local_c0._M_impl._0_4_ = _Var10;
        pvVar18 = (vector<float,std::allocator<float>> *)
                  std::
                  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&local_70,(key_type *)&local_c0);
        iVar6._M_current = *(float **)(pvVar18 + 8);
        if (iVar6._M_current == *(float **)(pvVar18 + 0x10)) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (pvVar18,iVar6,(float *)local_148);
        }
        else {
          *iVar6._M_current = (float)local_148._0_4_;
          *(float **)(pvVar18 + 8) = iVar6._M_current + 1;
        }
        p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
      } while (p_Var22 != p_Var24);
    }
  }
  else {
    local_78 = &this->ensembletosidx_;
    pmVar16 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](local_78,(key_type *)&s);
    local_90 = (ulong)((long)(pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
    pmVar4 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var19 = *(_Base_ptr *)((long)&pmVar4[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    local_80 = &pmVar4[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var19 != local_80) {
      do {
        local_108 = (_Base_ptr)CONCAT44(local_108._4_4_,*(undefined4 *)&p_Var19[1]._M_left);
        local_118 = *(undefined1 (*) [8])(p_Var19 + 1);
        auStack_110 = (undefined1  [8])p_Var19[1]._M_parent;
        local_d8 = p_Var19;
        pmVar16 = std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](local_78,(key_type *)&s);
        p_Var5 = (_Rb_tree_color *)
                 (pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var26 = (_Rb_tree_color *)
                       (pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; auVar13 = local_118, p_Var26 != p_Var5;
            p_Var26 = p_Var26 + 1) {
          uVar28 = auStack_110._0_4_;
          if (auStack_110._0_4_ == *p_Var26) {
            pcVar17 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar17 = *(code **)(*(long *)(auStack_110 + CONCAT44(in_register_0000000c,epcalc) + 4
                                            ) + -1 + GetOutLoss);
            }
            uVar27 = (*pcVar17)(auStack_110 + CONCAT44(in_register_0000000c,epcalc) + 4);
            local_148._0_4_ = uVar27;
            local_c0._M_impl._4_4_ = uVar28;
            local_c0._M_impl._0_4_ = auVar13._0_4_;
            pvVar18 = (vector<float,std::allocator<float>> *)
                      std::
                      map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_70,(key_type *)&local_c0);
            iVar6._M_current = *(float **)(pvVar18 + 8);
            if (iVar6._M_current == *(float **)(pvVar18 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar18,iVar6,(float *)local_148);
            }
            else {
              *iVar6._M_current = (float)local_148._0_4_;
              *(float **)(pvVar18 + 8) = iVar6._M_current + 1;
            }
          }
        }
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(local_d8);
      } while (p_Var19 != local_80);
    }
  }
  piVar7 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if (this->outputFlags_[*piVar7] == true) {
    if (this->ordFlag_ == true) {
      local_118 = (undefined1  [8])0x0;
      auStack_110 = (undefined1  [8])0x0;
      local_108 = (_Base_ptr)0x0;
      if (this->fout_[1] != (FILE *)0x0) {
        local_118 = (undefined1  [8])operator_new(4);
        *(int *)local_118 = 1;
        goto LAB_00109113;
      }
    }
    else {
      iVar2 = *piVar7;
      local_118 = (undefined1  [8])0x0;
      auStack_110 = (undefined1  [8])0x0;
      local_108 = (_Base_ptr)0x0;
      local_118 = (undefined1  [8])operator_new(4);
      *(int *)local_118 = iVar2;
LAB_00109113:
      local_108 = (_Base_ptr)((long)local_118 + 4);
    }
    auStack_110 = (undefined1  [8])local_108;
    WritePerSampleExceedanceProbabilityTable
              (this,(vector<int,_std::allocator<int>_> *)local_118,
               (map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&local_70,local_11c,ensemble_id);
    if (local_118 != (undefined1  [8])0x0) {
      operator_delete((void *)local_118);
    }
  }
  if (this->outputFlags_
      [(local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start[1]] == false) goto LAB_00109549;
  local_100 = (_Base_ptr)auStack_110;
  auStack_110 = (undefined1  [8])((ulong)auStack_110 & 0xffffffff00000000);
  local_108 = (_Base_ptr)0x0;
  local_f0 = 0;
  local_f8 = local_100;
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_70._M_impl.super__Rb_tree_header) {
    p_Var19 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_c0._M_impl._0_4_ = p_Var19[1]._M_color;
      local_c0._M_impl._4_4_ = *(undefined4 *)&p_Var19[1].field_0x4;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_c0._M_impl.super__Rb_tree_header,
                 (vector<float,_std::allocator<float>_> *)&p_Var19[1]._M_parent);
      p_Var14 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar25 = CONCAT44(local_c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                        local_c0._M_impl.super__Rb_tree_header._M_header._M_color);
      pmVar20 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_118,(key_type *)&local_c0);
      p_Var15 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (*pmVar20 < (ulong)((long)p_Var14 - lVar25 >> 2)) {
        lVar25 = CONCAT44(local_c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_c0._M_impl.super__Rb_tree_header._M_header._M_color);
        pmVar20 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)local_118,(key_type *)&local_c0);
        *pmVar20 = (long)p_Var15 - lVar25 >> 2;
      }
      if ((void *)CONCAT44(local_c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_c0._M_impl.super__Rb_tree_header._M_header._M_color) != (void *)0x0
         ) {
        operator_delete((void *)CONCAT44(local_c0._M_impl.super__Rb_tree_header._M_header._4_4_,
                                         local_c0._M_impl.super__Rb_tree_header._M_header._M_color))
        ;
      }
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while ((_Rb_tree_header *)p_Var19 != &local_70._M_impl.super__Rb_tree_header);
  }
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var22 = (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->summaryids_)._M_t._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var22 != p_Var1) {
    do {
      pmVar20 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_118,(key_type *)(p_Var22 + 1));
      local_d0 = (pointer)((ulong)local_d0 & 0xffffffff00000000);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_148,*pmVar20,
                 (value_type_conflict3 *)&local_d0,(allocator_type *)&local_88);
      pmVar21 = std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&local_c0,(key_type *)(p_Var22 + 1));
      pfVar8 = (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_148._0_8_;
      (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_148._8_8_;
      (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_138;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_138 = (pointer)0x0;
      if (pfVar8 != (pointer)0x0) {
        operator_delete(pfVar8);
      }
      if ((pointer)local_148._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._0_8_);
      }
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
    } while ((_Rb_tree_header *)p_Var22 != p_Var1);
  }
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_70._M_impl.super__Rb_tree_header) {
    p_Var19 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_148._0_8_ = *(undefined8 *)(p_Var19 + 1);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(local_148 + 8),
                 (vector<float,_std::allocator<float>_> *)&p_Var19[1]._M_parent);
      pfVar8 = local_138;
      uVar12 = local_148._8_8_;
      if ((long)local_138 - local_148._8_8_ != 0) {
        local_d0 = local_138;
        local_88 = (pointer)local_148._8_8_;
        uVar23 = (long)local_138 - local_148._8_8_ >> 2;
        lVar25 = 0x3f;
        if (uVar23 != 0) {
          for (; uVar23 >> lVar25 == 0; lVar25 = lVar25 + -1) {
          }
        }
        std::
        __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_d0,&local_88,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
        local_38 = pfVar8;
        local_40 = (pointer)uVar12;
        std::
        __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_38,&local_40);
      }
      pfVar8 = local_138;
      uVar12 = local_148._8_8_;
      if ((pointer)local_148._8_8_ != local_138) {
        lVar25 = 0;
        do {
          local_d8 = (_Base_ptr)CONCAT44(local_d8._4_4_,*(undefined4 *)(uVar12 + lVar25));
          pmVar21 = std::
                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&local_c0,(key_type *)local_148);
          pfVar9 = (pmVar21->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *(float *)((long)pfVar9 + lVar25) = local_d8._0_4_ + *(float *)((long)pfVar9 + lVar25);
          lVar11 = lVar25 + 4;
          lVar25 = lVar25 + 4;
        } while ((pointer)(uVar12 + lVar11) != pfVar8);
      }
      if ((pointer)local_148._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._8_8_);
      }
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while ((_Rb_tree_header *)p_Var19 != &local_70._M_impl.super__Rb_tree_header);
  }
  if (this->ordFlag_ == true) {
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_138 = (pointer)0x0;
    if (*this->fout_ != (FILE *)0x0) {
      local_148._0_8_ = operator_new(4);
      *(float *)local_148._0_8_ = 0.0;
      goto LAB_001094e6;
    }
  }
  else {
    fVar3 = (float)(local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[1];
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_138 = (pointer)0x0;
    local_148._0_8_ = operator_new(4);
    *(float *)local_148._0_8_ = fVar3;
LAB_001094e6:
    local_138 = (pointer)(local_148._0_8_ + 4);
  }
  local_148._8_8_ = local_138;
  WriteExceedanceProbabilityTable
            (this,(vector<int,_std::allocator<int>_> *)local_148,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&local_c0,(double)this->totalperiods_,local_c4,local_11c,ensemble_id,(int)local_90);
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               *)local_118);
LAB_00109549:
  std::
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMean(const std::vector<int> handles,
				OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				const int epcalc, const int eptype,
				const int eptype_tvar, int ensemble_id) {

  std::map<wheatkey, lossvec> items;
  int samplesize;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
    }
  }

  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
    WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype,
					     eptype_tvar);
  }

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  std::map<int, size_t> maxCount;
  for (auto x : items) {
    if (x.second.size() > maxCount[x.first.summary_id]) {
      maxCount[x.first.summary_id] = x.second.size();
    }
  }

  std::map<int, lossvec> mean_map;
  for (std::set<int>::iterator it = summaryids_.begin();
       it != summaryids_.end(); ++it) {
    mean_map[*it] = lossvec(maxCount[*it], 0);
  }

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    int i = 0;
    for (auto lp : lpv) {
      mean_map[s.first.summary_id][i] += lp;
      i++;
    }
  }

  std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar, samplesize);

}